

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ExtraLogging.cpp
# Opt level: O1

void __thiscall RenX_ExtraLoggingPlugin::RenX_ExtraLoggingPlugin(RenX_ExtraLoggingPlugin *this)

{
  tm *ptVar1;
  time_t current_time;
  time_t local_10;
  
  RenX::Plugin::Plugin(&this->super_Plugin);
  *(undefined ***)this = &PTR_think_0010c840;
  *(undefined ***)&this->field_0x8 = &PTR_OnRehash_0010cd20;
  (this->filePrefix)._M_dataplus._M_p = (pointer)&(this->filePrefix).field_2;
  (this->filePrefix)._M_string_length = 0;
  (this->filePrefix).field_2._M_local_buf[0] = '\0';
  (this->consolePrefix)._M_dataplus._M_p = (pointer)&(this->consolePrefix).field_2;
  (this->consolePrefix)._M_string_length = 0;
  (this->consolePrefix).field_2._M_local_buf[0] = '\0';
  (this->newDayFmt)._M_dataplus._M_p = (pointer)&(this->newDayFmt).field_2;
  (this->newDayFmt)._M_string_length = 0;
  (this->newDayFmt).field_2._M_local_buf[0] = '\0';
  local_10 = time((time_t *)0x0);
  ptVar1 = localtime(&local_10);
  this->day = ptVar1->tm_yday;
  return;
}

Assistant:

RenX_ExtraLoggingPlugin::RenX_ExtraLoggingPlugin()
{
    time_t current_time = time(nullptr);
    RenX_ExtraLoggingPlugin::day = localtime(&current_time)->tm_yday;
}